

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-binary.cpp
# Opt level: O2

void __thiscall wasm::WasmBinaryReader::readHeader(WasmBinaryReader *this)

{
  uint32_t uVar1;
  string local_58;
  string local_38;
  allocator<char> local_11;
  
  verifyInt32(this,0x6d736100);
  uVar1 = getInt32(this);
  if (uVar1 == 1) {
    return;
  }
  if (uVar1 == 0x1000d) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_58,
               "this looks like a wasm component, which Binaryen does not support yet (see https://github.com/WebAssembly/binaryen/issues/6728)"
               ,&local_11);
    throwError(this,&local_58);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_38,"invalid version",&local_11);
  throwError(this,&local_38);
}

Assistant:

void WasmBinaryReader::readHeader() {
  verifyInt32(BinaryConsts::Magic);
  auto version = getInt32();
  if (version != BinaryConsts::Version) {
    if (version == 0x1000d) {
      throwError("this looks like a wasm component, which Binaryen does not "
                 "support yet (see "
                 "https://github.com/WebAssembly/binaryen/issues/6728)");
    }
    throwError("invalid version");
  }
}